

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int fits_quantize_float(long row,float *fdata,long nxpix,long nypix,int nullcheck,
                       float in_null_value,float qlevel,int dither_method,int *idata,double *bscale,
                       double *bzero,int *iminval,int *imaxval)

{
  undefined1 auVar1 [16];
  float fVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  undefined4 uVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  uint uVar21;
  double dVar22;
  undefined8 in_XMM8_Qb;
  float minval;
  float maxval;
  float local_94;
  long ngood;
  double local_88;
  long local_80;
  double local_78;
  undefined8 uStack_70;
  float local_68;
  double noise5;
  double noise3;
  double noise2;
  int status;
  
  ngood = 0;
  iVar3 = 0;
  minval = 0.0;
  maxval = 0.0;
  lVar16 = nypix * nxpix;
  if (lVar16 < 2) {
    dVar17 = 0.0;
    local_78 = 1.0;
LAB_001f67d4:
    *bscale = local_78;
    *bzero = dVar17;
  }
  else {
    local_94 = in_null_value;
    if (0.0 <= qlevel) {
      local_78 = (double)CONCAT44(local_78._4_4_,dither_method);
      local_88 = (double)qlevel;
      local_80 = row;
      local_68 = qlevel;
      FnNoise5_float(fdata,nxpix,nypix,nullcheck,in_null_value,&ngood,&minval,&maxval,&noise2,
                     &noise3,&noise5,&status);
      if (ngood == 0 && nullcheck != 0) {
        minval = 0.0;
        maxval = 1.0;
        noise2 = 1.0;
      }
      else {
        if (noise3 <= noise2 || noise2 == 0.0) {
          noise2 = noise3;
        }
        if (((noise5 != 0.0) || (NAN(noise5))) && (noise5 < noise2)) {
          noise2 = noise5;
        }
      }
      in_XMM8_Qb = 0;
      dVar17 = noise2 / local_88;
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        dVar17 = noise2 * 0.25;
      }
      row = local_80;
      dither_method = local_78._0_4_;
      if ((dVar17 != 0.0) || (NAN(dVar17))) goto LAB_001f639c;
    }
    else {
      dVar17 = (double)-qlevel;
      lVar4 = 1;
      lVar15 = nypix;
      if (nxpix < 5) {
        lVar15 = 1;
        lVar4 = nypix;
      }
      lVar4 = lVar4 * nxpix;
      if (lVar4 < 5) {
        if (lVar4 < 1) {
          maxval = -3.4028235e+38;
          minval = 3.4028235e+38;
          ngood = 0;
        }
        else {
          minval = 3.4028235e+38;
          maxval = -3.4028235e+38;
          ngood = 0;
          lVar15 = 0;
          do {
            fVar20 = fdata[lVar15];
            if (nullcheck == 0) {
LAB_001f6016:
              fVar2 = fVar20;
              if (minval <= fVar20) {
                fVar2 = minval;
              }
              if (fVar20 <= maxval) {
                fVar20 = maxval;
              }
              ngood = ngood + 1;
              maxval = fVar20;
              minval = fVar2;
            }
            else if ((fVar20 != in_null_value) || (NAN(fVar20) || NAN(in_null_value)))
            goto LAB_001f6016;
            lVar15 = lVar15 + 1;
          } while (lVar4 - lVar15 != 0);
        }
      }
      else if (lVar15 < 1) {
        maxval = -3.4028235e+38;
        minval = 3.4028235e+38;
        ngood = 0;
      }
      else {
        minval = 3.4028235e+38;
        maxval = -3.4028235e+38;
        ngood = 0;
        lVar10 = 0;
        pfVar9 = fdata;
        do {
          lVar13 = 0;
          if (nullcheck == 0) {
LAB_001f6142:
            if (lVar13 != lVar4) {
              lVar12 = lVar10 * lVar4;
              fVar20 = fdata[lVar12 + lVar13];
              fVar2 = fVar20;
              if (minval <= fVar20) {
                fVar2 = minval;
              }
              if (fVar20 <= maxval) {
                fVar20 = maxval;
              }
              lVar13 = lVar13 + 1;
              maxval = fVar20;
              minval = fVar2;
              if (lVar13 < lVar4 && nullcheck != 0) {
                do {
                  if ((pfVar9[lVar13] != in_null_value) ||
                     (NAN(pfVar9[lVar13]) || NAN(in_null_value))) goto LAB_001f6195;
                  lVar13 = lVar13 + 1;
                } while (lVar4 - lVar13 != 0);
              }
              else {
LAB_001f6195:
                if (lVar13 != lVar4) {
                  lVar14 = lVar13 + 1;
                  maxval = fdata[lVar12 + lVar13];
                  minval = maxval;
                  if (fVar2 <= maxval) {
                    minval = fVar2;
                  }
                  if (maxval <= fVar20) {
                    maxval = fVar20;
                  }
                  if ((nullcheck == 0) || (lVar4 <= lVar14)) {
LAB_001f61eb:
                    if (lVar14 != lVar4) {
                      lVar13 = lVar14 + 1;
                      fVar20 = fdata[lVar12 + lVar14];
                      fVar2 = fVar20;
                      if (minval <= fVar20) {
                        fVar2 = minval;
                      }
                      if (fVar20 <= maxval) {
                        fVar20 = maxval;
                      }
                      maxval = fVar20;
                      minval = fVar2;
                      if ((nullcheck == 0) || (lVar4 <= lVar13)) {
LAB_001f6227:
                        if (lVar13 != lVar4) {
                          maxval = fdata[lVar12 + lVar13];
                          minval = maxval;
                          if (fVar2 <= maxval) {
                            minval = fVar2;
                          }
                          if (maxval <= fVar20) {
                            maxval = fVar20;
                          }
                          while (lVar13 = lVar13 + 1, lVar13 < lVar4) {
                            if ((nullcheck != 0) && (lVar13 < lVar4)) {
                              while( true ) {
                                if ((pfVar9[lVar13] != in_null_value) ||
                                   (NAN(pfVar9[lVar13]) || NAN(in_null_value))) break;
                                lVar13 = lVar13 + 1;
                                if (lVar4 - lVar13 == 0) goto LAB_001f62a1;
                              }
                            }
                            if (lVar13 == lVar4) break;
                            fVar20 = fdata[lVar12 + lVar13];
                            fVar2 = fVar20;
                            if (minval <= fVar20) {
                              fVar2 = minval;
                            }
                            if (fVar20 <= maxval) {
                              fVar20 = maxval;
                            }
                            ngood = ngood + 1;
                            maxval = fVar20;
                            minval = fVar2;
                          }
LAB_001f62a1:
                          ngood = ngood + 4;
                        }
                      }
                      else {
                        do {
                          if ((pfVar9[lVar13] != in_null_value) ||
                             (NAN(pfVar9[lVar13]) || NAN(in_null_value))) goto LAB_001f6227;
                          lVar13 = lVar13 + 1;
                        } while (lVar4 - lVar13 != 0);
                      }
                    }
                  }
                  else {
                    do {
                      if ((pfVar9[lVar14] != in_null_value) ||
                         (NAN(pfVar9[lVar14]) || NAN(in_null_value))) goto LAB_001f61eb;
                      lVar14 = lVar14 + 1;
                    } while (lVar4 - lVar14 != 0);
                  }
                }
              }
            }
          }
          else {
            do {
              if ((pfVar9[lVar13] != in_null_value) || (NAN(pfVar9[lVar13]) || NAN(in_null_value)))
              goto LAB_001f6142;
              lVar13 = lVar13 + 1;
            } while (lVar4 - lVar13 != 0);
          }
          lVar10 = lVar10 + 1;
          pfVar9 = pfVar9 + lVar4;
        } while (lVar10 != lVar15);
      }
LAB_001f639c:
      local_78 = dVar17;
      if ((double)(maxval - minval) / local_78 <= 4294967284.0) {
        if (row < 1) {
          iVar3 = 0;
          uVar8 = 0;
          if (ngood == lVar16) goto LAB_001f6514;
          dVar17 = local_78 * 2147483637.0 + (double)minval;
LAB_001f65f5:
          lVar15 = 0;
          uVar6 = 0x21ce10;
          do {
            fVar20 = fdata[lVar15];
            if ((fVar20 != local_94) || (NAN(fVar20) || NAN(local_94))) {
              dVar22 = ((double)fVar20 - dVar17) / local_78;
              iVar3 = (int)(dVar22 + *(double *)(&DAT_0021ce10 + (ulong)(dVar22 < 0.0) * 8));
            }
            else {
              iVar3 = -0x7fffffff;
            }
            idata[lVar15] = iVar3;
            lVar15 = lVar15 + 1;
          } while (lVar16 - lVar15 != 0);
        }
        else {
          if ((fits_rand_value == (float *)0x0) &&
             (uStack_70 = in_XMM8_Qb, iVar3 = fits_init_randoms(), iVar3 != 0)) {
            return 0x71;
          }
          pfVar9 = fits_rand_value;
          uVar8 = (ulong)(uint)((int)(row - 1U) + (int)((row - 1U) / 10000) * -10000);
          iVar3 = (int)(fits_rand_value[uVar8] * 500.0);
          if (ngood == lVar16) {
LAB_001f6514:
            pfVar9 = fits_rand_value;
            if (dither_method == 2) {
              dVar17 = local_78 * 2147483637.0 + (double)minval;
            }
            else if (2147483637.0 <= (double)(maxval - minval) / local_78) {
              dVar17 = (double)(maxval + minval) * 0.5;
            }
            else {
              dVar17 = (double)(long)((double)minval / local_78 + 0.5) * local_78;
            }
            if (row < 1) {
              lVar15 = 0;
              uVar6 = 0x21ce10;
              do {
                dVar22 = ((double)fdata[lVar15] - dVar17) / local_78;
                idata[lVar15] =
                     (int)(dVar22 + *(double *)(&DAT_0021ce10 + (ulong)(dVar22 < 0.0) * 8));
                lVar15 = lVar15 + 1;
              } while (lVar16 - lVar15 != 0);
            }
            else {
              lVar15 = 0;
              do {
                fVar20 = fdata[lVar15];
                if (dither_method == 2) {
                  iVar11 = -0x7ffffffe;
                  if ((fVar20 != 0.0) || (NAN(fVar20))) goto LAB_001f66a5;
                }
                else {
LAB_001f66a5:
                  dVar22 = (double)pfVar9[iVar3] + ((double)fVar20 - dVar17) / local_78 + -0.5;
                  iVar11 = (int)(dVar22 + *(double *)(&DAT_0021ce10 + (ulong)(dVar22 < 0.0) * 8));
                }
                idata[lVar15] = iVar11;
                iVar3 = iVar3 + 1;
                if (iVar3 == 10000) {
                  uVar5 = (int)uVar8 + 1;
                  uVar8 = (ulong)uVar5;
                  if (uVar5 == 10000) {
                    uVar8 = 0;
                  }
                  iVar3 = (int)(pfVar9[(int)uVar8] * 500.0);
                }
                uVar6 = (undefined4)uVar8;
                lVar15 = lVar15 + 1;
              } while (lVar16 - lVar15 != 0);
            }
          }
          else {
            dVar17 = local_78 * 2147483637.0 + (double)minval;
            if (row < 1) goto LAB_001f65f5;
            lVar15 = 0;
            do {
              fVar20 = fdata[lVar15];
              if ((fVar20 != local_94) || (NAN(fVar20) || NAN(local_94))) {
                if (dither_method == 2) {
                  iVar11 = -0x7ffffffe;
                  if ((fVar20 == 0.0) && (!NAN(fVar20))) goto LAB_001f64cb;
                }
                dVar22 = (double)pfVar9[iVar3] + ((double)fVar20 - dVar17) / local_78 + -0.5;
                iVar11 = (int)(dVar22 + *(double *)(&DAT_0021ce10 + (ulong)(dVar22 < 0.0) * 8));
              }
              else {
                iVar11 = -0x7fffffff;
              }
LAB_001f64cb:
              idata[lVar15] = iVar11;
              iVar3 = iVar3 + 1;
              if (iVar3 == 10000) {
                uVar5 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar5;
                if (uVar5 == 10000) {
                  uVar8 = 0;
                }
                iVar3 = (int)(pfVar9[(int)uVar8] * 500.0);
              }
              uVar6 = (undefined4)uVar8;
              lVar15 = lVar15 + 1;
            } while (lVar16 - lVar15 != 0);
          }
        }
        auVar18._0_8_ = (double)maxval - dVar17;
        auVar18._8_8_ = (double)minval - dVar17;
        auVar19._8_4_ = SUB84(local_78,0);
        auVar19._0_8_ = local_78;
        auVar19._12_4_ = (int)((ulong)local_78 >> 0x20);
        auVar19 = divpd(auVar18,auVar19);
        lVar16 = -(ulong)(auVar19._8_8_ < 0.0);
        auVar1._8_4_ = (int)lVar16;
        auVar1._0_8_ = -(ulong)(auVar19._0_8_ < 0.0);
        auVar1._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar7 = movmskpd(uVar6,auVar1);
        uVar21 = 0xbfe00000;
        uVar5 = uVar21;
        if ((uVar7 & 2) == 0) {
          uVar5 = 0x3fe00000;
        }
        *iminval = (int)(auVar19._8_8_ + (double)((ulong)uVar5 << 0x20));
        if ((uVar7 & 1) == 0) {
          uVar21 = 0x3fe00000;
        }
        *imaxval = (int)(auVar19._0_8_ + (double)((ulong)uVar21 << 0x20));
        iVar3 = 1;
        goto LAB_001f67d4;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int fits_quantize_float (long row, float fdata[], long nxpix, long nypix, int nullcheck, 
	float in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: if positive, used to calculate random dithering seed value
                       (this is only used when dithering the quantized values)
float fdata[]       i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
float in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2, noise3, noise5;	/* MAD 2nd, 3rd, and 5th order noise values */
	float minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value; /* this is defined in imcompress.c */
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	        if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500.);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
              for (i = 0;  i < nx;  i++) {
	    
		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
 
                 if (fdata[i] != in_null_value) {
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 } else { 
                    idata[i] = NULL_VALUE;
                 }
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;
	return (1);			/* yes, data have been quantized */
}